

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::repl::repl(repl *this,context_t *c)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  cni_holder_base *pcVar4;
  any aStack_58;
  cni local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_Deque_base((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)this);
  stack_type<cs::method_base_*,_std::allocator>::stack_type(&this->methods);
  this->encoding = utf8;
  this->line_num = 0;
  this->multi_line = false;
  (this->line_buff)._M_dataplus._M_p = (pointer)&(this->line_buff).field_2;
  (this->line_buff)._M_string_length = 0;
  (this->line_buff).field_2._M_local_buf[0] = '\0';
  (this->cmd_buff)._M_dataplus._M_p = (pointer)&(this->cmd_buff).field_2;
  (this->cmd_buff)._M_string_length = 0;
  (this->cmd_buff).field_2._M_local_buf[0] = '\0';
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  this->echo = true;
  std::__cxx11::string::assign
            ((char *)&((this->context).
                       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      file_path);
  peVar1 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ((peVar1->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  fold_expr = false;
  peVar2 = (peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar4 = (cni_holder_base *)operator_new(0x28);
  pcVar4->_vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_0037cdc0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:332:67)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:332:67)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)(pcVar4 + 1),(function<void_()> *)&local_48)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_48._M_unused._M_member_pointer = local_48._M_unused._M_member_pointer & 0xffffffff00000000;
  local_50.mCni = pcVar4;
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            (&aStack_58,&local_50,(types *)local_48._M_pod_data);
  if (local_50.mCni != (cni_holder_base *)0x0) {
    (*(local_50.mCni)->_vptr_cni_holder_base[1])();
  }
  domain_manager::add_buildin_var<char_const(&)[5]>
            (&(peVar2->super_runtime_type).storage,(char (*) [5])"quit",&aStack_58);
  cs_impl::any::recycle(&aStack_58);
  return;
}

Assistant:

repl::repl(context_t c) : context(std::move(c))
	{
		context->file_path = "<REPL_ENV>";
		context->compiler->fold_expr = false;
		context->instance->storage.add_buildin_var("quit", cs::make_cni([]() {
			int code = 0;
			cs::current_process->on_process_exit.touch(&code);
		}));
	}